

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedate.c
# Opt level: O1

int parsedate(char *date,time_t *output)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int *piVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  int i;
  uint uVar12;
  int iVar13;
  char **what;
  char **ppcVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  int secnum;
  int len;
  int minnum;
  int hournum;
  char buf [32];
  uint local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  byte *local_78;
  ulong local_70;
  byte *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  long *local_40;
  byte *local_38;
  
  iVar13 = -1;
  local_7c = -1;
  local_80 = -1;
  local_8c = -1;
  bVar18 = false;
  local_70 = 0xffffffff;
  iVar6 = 0;
  local_90 = 0xffffffff;
  uVar12 = 0xffffffff;
  lVar11 = 0xffffffff;
  local_40 = output;
  local_38 = (byte *)date;
  do {
    bVar1 = *date;
    if ((bVar1 == 0) || (5 < iVar6)) {
      if (local_8c == -1) {
        local_7c = 0;
        local_80 = 0;
        local_8c = 0;
      }
      iVar6 = (int)local_70;
      if (local_90 == 0xffffffff) {
        return -1;
      }
      if (uVar12 == 0xffffffff) {
        return -1;
      }
      if (iVar6 < 0x62f) {
        return -1;
      }
      if ((0x3c < local_8c || 0x3b < local_80) ||
          (0x17 < local_7c || (0xb < (int)uVar12 || 0x1f < (int)local_90))) {
        return -1;
      }
      uVar7 = uVar12;
      if ((int)uVar12 < 0) {
        uVar7 = (0xb - uVar12) / 0xc;
        iVar6 = iVar6 + uVar7;
        uVar7 = (uVar7 * 0xc - (0xb - uVar12)) + 0xb;
      }
      if (iVar13 == -1) {
        iVar13 = 0;
      }
      iVar9 = iVar6 - (uint)((int)uVar12 < 2);
      iVar5 = (iVar6 - (uint)((int)uVar12 < 2)) + 3;
      if (-1 < iVar9) {
        iVar5 = iVar9;
      }
      iVar2 = (int)((ulong)((long)iVar9 * -0x51eb851f) >> 0x20);
      *local_40 = (long)iVar13 +
                  (((long)local_7c +
                   ((long)(iVar9 / 400 + ((iVar2 >> 5) - (iVar2 >> 0x1f)) + (iVar5 >> 2) + -0x1dd) +
                   (long)(iVar6 + -0x7b2) * 0x16d + (long)(int)local_90 +
                   (long)*(int *)(my_timegm_month_days_cumulative + (ulong)uVar7 * 4)) * 0x18) *
                   0x3c + (long)local_80) * 0x3c + (long)local_8c + -0x15180;
      return 0;
    }
    do {
      iVar5 = Curl_isalnum((uint)bVar1);
      if (iVar5 != 0) break;
      bVar1 = ((byte *)date)[1];
      date = (char *)((byte *)date + 1);
    } while (bVar1 != 0);
    iVar5 = Curl_isalpha((uint)(byte)*date);
    if (iVar5 == 0) {
      iVar5 = Curl_isdigit((uint)(byte)*date);
      if (iVar5 == 0) goto LAB_0012f12c;
      local_84 = 0;
      if ((local_8c == -1) &&
         (iVar5 = __isoc99_sscanf(date,"%02d:%02d:%02d%n",&local_7c,&local_80,&local_8c,&local_84),
         iVar5 == 3)) {
LAB_0012ee97:
        date = (char *)((byte *)date + local_84);
        bVar17 = true;
      }
      else {
        if ((local_8c == -1) &&
           (iVar5 = __isoc99_sscanf(date,"%02d:%02d%n",&local_7c,&local_80,&local_84), iVar5 == 2))
        {
          local_8c = 0;
          goto LAB_0012ee97;
        }
        local_78 = (byte *)CONCAT44(local_78._4_4_,iVar13);
        local_88 = iVar6;
        piVar8 = __errno_location();
        iVar13 = *piVar8;
        *piVar8 = 0;
        lVar15 = strtol(date,(char **)&local_68,10);
        iVar6 = local_88;
        iVar5 = *piVar8;
        if (iVar5 != iVar13) {
          *piVar8 = iVar13;
        }
        bVar17 = false;
        iVar13 = (int)local_78;
        if ((iVar5 == 0) && (0xfffffffeffffffff < lVar15 - 0x80000000U)) {
          uVar7 = curlx_sltosi(lVar15);
          if (iVar13 == -1) {
            iVar13 = -1;
            bVar3 = false;
            if (((local_38 < date) && (bVar3 = false, (long)local_68 - (long)date == 4)) &&
               (bVar3 = false, (int)uVar7 < 0x579)) {
              bVar1 = ((byte *)date)[-1];
              if ((bVar1 != 0x2d) && (bVar1 != 0x2b)) goto LAB_0012ef52;
              iVar5 = uVar7 + ((int)uVar7 / 100) * -0x28;
              iVar13 = iVar5 * -0x3c;
              if (bVar1 != 0x2b) {
                iVar13 = iVar5 * 0x3c;
              }
              bVar3 = true;
            }
          }
          else {
LAB_0012ef52:
            bVar3 = false;
          }
          local_78 = local_68;
          if ((((long)local_68 - (long)date == 8) && ((int)local_70 == -1)) &&
             ((uVar12 == 0xffffffff && (local_90 == 0xffffffff)))) {
            local_70 = (ulong)(uint)((int)uVar7 / 10000);
            uVar12 = ((int)uVar7 % 10000) / 100 - 1;
            local_90 = (int)uVar7 % 100;
            bVar3 = true;
          }
          bVar16 = uVar7 - 1 < 0x1f;
          uVar10 = 0xffffffff;
          if (bVar16) {
            uVar10 = uVar7;
          }
          bVar4 = true;
          bVar17 = bVar3;
          if (bVar16) {
            bVar17 = true;
          }
          if (!(bool)(!bVar18 & ~bVar3 & local_90 == 0xffffffff)) {
            uVar10 = local_90;
            bVar17 = bVar3;
            bVar4 = bVar18;
          }
          bVar18 = bVar4;
          if (((!bVar17) && (bVar4)) && ((int)local_70 == -1)) {
            if ((int)uVar7 < 100) {
              if ((int)uVar7 < 0x47) {
                uVar7 = uVar7 + 2000;
              }
              else {
                uVar7 = uVar7 + 0x76c;
              }
            }
            local_70 = (ulong)uVar7;
            bVar18 = uVar10 != 0xffffffff;
            bVar17 = true;
          }
          local_90 = uVar10;
          if (bVar17) {
            date = (char *)local_68;
          }
        }
      }
      if (bVar17) goto LAB_0012f12c;
      bVar17 = false;
    }
    else {
      local_58 = 0;
      uStack_50 = 0;
      local_68 = (byte *)0x0;
      uStack_60 = 0;
      iVar5 = __isoc99_sscanf(date,"%31[ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz]",
                              &local_68);
      if (iVar5 == 0) {
        local_78 = (byte *)0x0;
      }
      else {
        local_78 = (byte *)strlen((char *)&local_68);
      }
      if ((int)lVar11 == -1) {
        ppcVar14 = Curl_wkday;
        if ((byte *)0x3 < local_78) {
          ppcVar14 = weekday;
        }
        lVar11 = 0;
        local_88 = iVar6;
        do {
          iVar6 = Curl_strcasecompare((char *)&local_68,ppcVar14[lVar11]);
          if (iVar6 != 0) goto LAB_0012edb9;
          lVar11 = lVar11 + 1;
        } while ((int)lVar11 != 7);
        lVar11 = 0xffffffff;
LAB_0012edb9:
        bVar17 = (int)lVar11 != -1;
      }
      else {
        bVar17 = false;
        local_88 = iVar6;
      }
      if ((!bVar17) && (uVar12 == 0xffffffff)) {
        uVar12 = 0;
        ppcVar14 = Curl_month;
        do {
          iVar6 = Curl_strcasecompare((char *)&local_68,*ppcVar14);
          if (iVar6 != 0) goto LAB_0012edff;
          ppcVar14 = ppcVar14 + 1;
          uVar12 = uVar12 + 1;
        } while (uVar12 != 0xc);
        uVar12 = 0xffffffff;
LAB_0012edff:
        bVar17 = uVar12 != 0xffffffff;
      }
      if ((!bVar17) && (iVar13 == -1)) {
        lVar15 = 0;
        do {
          iVar6 = Curl_strcasecompare((char *)&local_68,tz[0].name + lVar15);
          if (iVar6 != 0) {
            iVar13 = *(int *)(tz[0].name + lVar15 + 8) * 0x3c;
            goto LAB_0012eeab;
          }
          lVar15 = lVar15 + 0xc;
        } while ((int)lVar15 != 0x33c);
        iVar13 = -1;
LAB_0012eeab:
        bVar17 = iVar13 != -1;
      }
      iVar6 = local_88;
      if (bVar17) {
        date = (char *)((byte *)date + (long)local_78);
LAB_0012f12c:
        bVar17 = true;
        iVar6 = iVar6 + 1;
      }
      else {
        bVar17 = false;
      }
    }
    if (!bVar17) {
      return -1;
    }
  } while( true );
}

Assistant:

static int parsedate(const char *date, time_t *output)
{
  time_t t = 0;
  int wdaynum = -1;  /* day of the week number, 0-6 (mon-sun) */
  int monnum = -1;   /* month of the year number, 0-11 */
  int mdaynum = -1; /* day of month, 1 - 31 */
  int hournum = -1;
  int minnum = -1;
  int secnum = -1;
  int yearnum = -1;
  int tzoff = -1;
  struct my_tm tm;
  enum assume dignext = DATE_MDAY;
  const char *indate = date; /* save the original pointer */
  int part = 0; /* max 6 parts */

  while(*date && (part < 6)) {
    bool found = FALSE;

    skip(&date);

    if(ISALPHA(*date)) {
      /* a name coming up */
      char buf[32]="";
      size_t len;
      if(sscanf(date, "%31[ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                          "abcdefghijklmnopqrstuvwxyz]", buf))
        len = strlen(buf);
      else
        len = 0;

      if(wdaynum == -1) {
        wdaynum = checkday(buf, len);
        if(wdaynum != -1)
          found = TRUE;
      }
      if(!found && (monnum == -1)) {
        monnum = checkmonth(buf);
        if(monnum != -1)
          found = TRUE;
      }

      if(!found && (tzoff == -1)) {
        /* this just must be a time zone string */
        tzoff = checktz(buf);
        if(tzoff != -1)
          found = TRUE;
      }

      if(!found)
        return PARSEDATE_FAIL; /* bad string */

      date += len;
    }
    else if(ISDIGIT(*date)) {
      /* a digit */
      int val;
      char *end;
      int len = 0;
      if((secnum == -1) &&
         (3 == sscanf(date, "%02d:%02d:%02d%n",
                      &hournum, &minnum, &secnum, &len))) {
        /* time stamp! */
        date += len;
      }
      else if((secnum == -1) &&
              (2 == sscanf(date, "%02d:%02d%n", &hournum, &minnum, &len))) {
        /* time stamp without seconds */
        date += len;
        secnum = 0;
      }
      else {
        long lval;
        int error;
        int old_errno;

        old_errno = errno;
        errno = 0;
        lval = strtol(date, &end, 10);
        error = errno;
        if(errno != old_errno)
          errno = old_errno;

        if(error)
          return PARSEDATE_FAIL;

#if LONG_MAX != INT_MAX
        if((lval > (long)INT_MAX) || (lval < (long)INT_MIN))
          return PARSEDATE_FAIL;
#endif

        val = curlx_sltosi(lval);

        if((tzoff == -1) &&
           ((end - date) == 4) &&
           (val <= 1400) &&
           (indate< date) &&
           ((date[-1] == '+' || date[-1] == '-'))) {
          /* four digits and a value less than or equal to 1400 (to take into
             account all sorts of funny time zone diffs) and it is preceded
             with a plus or minus. This is a time zone indication.  1400 is
             picked since +1300 is frequently used and +1400 is mentioned as
             an edge number in the document "ISO C 200X Proposal: Timezone
             Functions" at http://david.tribble.com/text/c0xtimezone.html If
             anyone has a more authoritative source for the exact maximum time
             zone offsets, please speak up! */
          found = TRUE;
          tzoff = (val/100 * 60 + val%100)*60;

          /* the + and - prefix indicates the local time compared to GMT,
             this we need their reversed math to get what we want */
          tzoff = date[-1]=='+'?-tzoff:tzoff;
        }

        if(((end - date) == 8) &&
           (yearnum == -1) &&
           (monnum == -1) &&
           (mdaynum == -1)) {
          /* 8 digits, no year, month or day yet. This is YYYYMMDD */
          found = TRUE;
          yearnum = val/10000;
          monnum = (val%10000)/100-1; /* month is 0 - 11 */
          mdaynum = val%100;
        }

        if(!found && (dignext == DATE_MDAY) && (mdaynum == -1)) {
          if((val > 0) && (val<32)) {
            mdaynum = val;
            found = TRUE;
          }
          dignext = DATE_YEAR;
        }

        if(!found && (dignext == DATE_YEAR) && (yearnum == -1)) {
          yearnum = val;
          found = TRUE;
          if(yearnum < 100) {
            if(yearnum > 70)
              yearnum += 1900;
            else
              yearnum += 2000;
          }
          if(mdaynum == -1)
            dignext = DATE_MDAY;
        }

        if(!found)
          return PARSEDATE_FAIL;

        date = end;
      }
    }

    part++;
  }

  if(-1 == secnum)
    secnum = minnum = hournum = 0; /* no time, make it zero */

  if((-1 == mdaynum) ||
     (-1 == monnum) ||
     (-1 == yearnum))
    /* lacks vital info, fail */
    return PARSEDATE_FAIL;

#ifdef HAVE_TIME_T_UNSIGNED
  if(yearnum < 1970) {
    /* only positive numbers cannot return earlier */
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#if (SIZEOF_TIME_T < 5)

#ifdef HAVE_TIME_T_UNSIGNED
  /* an unsigned 32 bit time_t can only hold dates to 2106 */
  if(yearnum > 2105) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
#else
  /* a signed 32 bit time_t can only hold dates to the beginning of 2038 */
  if(yearnum > 2037) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER;
  }
  if(yearnum < 1903) {
    *output = TIME_T_MIN;
    return PARSEDATE_SOONER;
  }
#endif

#else
  /* The Gregorian calendar was introduced 1582 */
  if(yearnum < 1583)
    return PARSEDATE_FAIL;
#endif

  if((mdaynum > 31) || (monnum > 11) ||
     (hournum > 23) || (minnum > 59) || (secnum > 60))
    return PARSEDATE_FAIL; /* clearly an illegal date */

  tm.tm_sec = secnum;
  tm.tm_min = minnum;
  tm.tm_hour = hournum;
  tm.tm_mday = mdaynum;
  tm.tm_mon = monnum;
  tm.tm_year = yearnum;

  /* my_timegm() returns a time_t. time_t is often 32 bits, sometimes even on
     architectures that feature 64 bit 'long' but ultimately time_t is the
     correct data type to use.
  */
  my_timegm(&tm, &t);

  /* Add the time zone diff between local time zone and GMT. */
  if(tzoff == -1)
    tzoff = 0;

  if((tzoff > 0) && (t > TIME_T_MAX - tzoff)) {
    *output = TIME_T_MAX;
    return PARSEDATE_LATER; /* time_t overflow */
  }

  t += tzoff;

  *output = t;

  return PARSEDATE_OK;
}